

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleComputeInstance::writeDescriptorSet
          (ImageSampleComputeInstance *this,VkDescriptorSet descriptorSet,
          VkDescriptorSetLayout layout,VkPipelineLayout pipelineLayout)

{
  DescriptorSetUpdateBuilder *pDVar1;
  ShaderInputInterface SVar2;
  DescriptorUpdateMethod DVar3;
  void *__buf;
  undefined1 *__buf_00;
  int __fd;
  
  __fd = (int)descriptorSet.m_internal;
  switch(this->m_updateMethod) {
  case DESCRIPTOR_UPDATE_METHOD_NORMAL:
    if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
      if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_SAMPLER) {
        return;
      }
      pDVar1 = &this->m_updateBuilder;
      ::vk::DescriptorSetUpdateBuilder::write(pDVar1,__fd,(void *)0x0,0);
      ::vk::DescriptorSetUpdateBuilder::write(pDVar1,__fd,&DAT_00000001,0);
      DVar3 = this->m_updateMethod;
      if ((this->m_isImmutableSampler & DVar3 != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) != 0)
      goto LAB_0053a9ae;
      SVar2 = this->m_shaderInterface;
      if (SVar2 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        __buf = (void *)0x2;
LAB_0053a9a3:
        ::vk::DescriptorSetUpdateBuilder::write(pDVar1,__fd,__buf,0);
      }
      else {
        if (SVar2 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
          ::vk::DescriptorSetUpdateBuilder::write(pDVar1,__fd,(void *)0x2,0);
          __buf = (void *)0x3;
          goto LAB_0053a9a3;
        }
        if (SVar2 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
          __buf = (void *)0x2;
          goto LAB_0053a9a3;
        }
      }
      DVar3 = this->m_updateMethod;
LAB_0053a9ae:
      if (DVar3 == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
        ::vk::DescriptorSetUpdateBuilder::update(pDVar1,this->m_vki,this->m_device);
      }
      return;
    }
    goto LAB_0053aa25;
  case DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE:
    if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
      writeImageSamplerDescriptorSetWithTemplate
                (this,descriptorSet,layout,false,(VkPipelineLayout)0x0);
      return;
    }
    if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
      writeSamplerDescriptorSetWithTemplate(this,descriptorSet,layout,false,(VkPipelineLayout)0x0);
      return;
    }
    break;
  case DESCRIPTOR_UPDATE_METHOD_WITH_PUSH:
    if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
      if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_SAMPLER) {
        return;
      }
      writeSamplerDescriptorSet(this,descriptorSet);
      return;
    }
LAB_0053aa25:
    pDVar1 = &this->m_updateBuilder;
    ::vk::DescriptorSetUpdateBuilder::write(pDVar1,__fd,(void *)0x0,0);
    SVar2 = this->m_shaderInterface;
    if (SVar2 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
      __buf_00 = &DAT_00000001;
    }
    else if (SVar2 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      ::vk::DescriptorSetUpdateBuilder::write(pDVar1,__fd,&DAT_00000001,0);
      __buf_00 = (undefined1 *)0x2;
    }
    else {
      if (SVar2 != SHADER_INPUT_SINGLE_DESCRIPTOR) goto LAB_0053ab44;
      __buf_00 = &DAT_00000001;
    }
    ::vk::DescriptorSetUpdateBuilder::write(pDVar1,__fd,__buf_00,0);
LAB_0053ab44:
    if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
      ::vk::DescriptorSetUpdateBuilder::update(pDVar1,this->m_vki,this->m_device);
    }
    return;
  case DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE:
    if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
      writeImageSamplerDescriptorSetWithTemplate(this,descriptorSet,layout,true,pipelineLayout);
      return;
    }
    if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
      writeSamplerDescriptorSetWithTemplate(this,descriptorSet,layout,true,pipelineLayout);
      return;
    }
  }
  return;
}

Assistant:

void ImageSampleComputeInstance::writeDescriptorSet (vk::VkDescriptorSet descriptorSet, vk::VkDescriptorSetLayout layout, vk::VkPipelineLayout pipelineLayout)
{
	if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE)
	{
		if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
			writeSamplerDescriptorSetWithTemplate(descriptorSet, layout);
		else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			writeImageSamplerDescriptorSetWithTemplate(descriptorSet, layout);
		else
			DE_FATAL("Impossible");
	}
	else if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE)
	{
		if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
			writeSamplerDescriptorSetWithTemplate(descriptorSet, layout, true, pipelineLayout);
		else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			writeImageSamplerDescriptorSetWithTemplate(descriptorSet, layout, true, pipelineLayout);
		else
			DE_FATAL("Impossible");
	}
	else if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)
	{
		if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
			writeSamplerDescriptorSet(descriptorSet);
		else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			writeImageSamplerDescriptorSet(descriptorSet);
		else
			DE_FATAL("Impossible");
	}
	else if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL)
	{
		if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
			writeSamplerDescriptorSet(descriptorSet);
		else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			writeImageSamplerDescriptorSet(descriptorSet);
		else
			DE_FATAL("Impossible");
	}
}